

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O3

void __thiscall
HashUtil_Sha256BytePubkey_Test::~HashUtil_Sha256BytePubkey_Test
          (HashUtil_Sha256BytePubkey_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HashUtil, Sha256BytePubkey) {
  Pubkey target(
      "032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db");
  ByteData256 byte_data = HashUtil::Sha256(target);
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "2213d0c45bf1ece1a9b0c2d5a21d603601e88e22ae2786fe3f0060ee4aad321d");
}